

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O1

int ffcprw(fitsfile *infptr,fitsfile *outfptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  LONGLONG *pLVar1;
  int iVar2;
  FITSfile *pFVar3;
  bool bVar4;
  int iVar5;
  uchar *values;
  int *piVar6;
  void *pvVar7;
  void *extraout_RAX;
  long lVar8;
  size_t __size;
  long lVar9;
  long *plVar10;
  long lVar11;
  int nInVarCols;
  LONGLONG innaxis1;
  int nOutVarCols;
  LONGLONG hrepeat;
  LONGLONG hoffset;
  LONGLONG outnaxis2;
  LONGLONG outnaxis1;
  LONGLONG innaxis2;
  void *local_c8;
  int local_bc;
  size_t local_b8;
  int local_ac;
  int *local_a8;
  long local_a0;
  long *local_98;
  LONGLONG local_90;
  size_t local_88;
  int *local_80;
  size_t local_78;
  long local_70;
  LONGLONG local_68;
  long local_60;
  size_t local_58;
  long local_50;
  long local_48;
  size_t local_40;
  long local_38;
  
  local_bc = 0;
  local_ac = 0;
  local_88 = 0;
  local_68 = 0;
  if (0 < *status) {
    return *status;
  }
  if (infptr->HDUposition == infptr->Fptr->curhdu) {
    if (infptr->Fptr->datastart == -1) {
      ffrdef(infptr,status);
    }
  }
  else {
    ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
  }
  if (outfptr->HDUposition == outfptr->Fptr->curhdu) {
    if (outfptr->Fptr->datastart == -1) {
      ffrdef(outfptr,status);
    }
  }
  else {
    ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
  }
  if (0 < *status) {
    return *status;
  }
  iVar5 = infptr->Fptr->hdutype;
  if ((iVar5 == 0) || (iVar2 = outfptr->Fptr->hdutype, iVar2 == 0)) {
    ffpmsg("Can not copy rows to or from IMAGE HDUs (ffcprw)");
    *status = 0xeb;
    return 0xeb;
  }
  if ((iVar2 == 1 && iVar5 == 2) || (iVar2 == 2 && iVar5 == 1)) {
    ffpmsg("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
    *status = 0xe3;
    return 0xe3;
  }
  ffgkyjj(infptr,"NAXIS1",(LONGLONG *)&local_b8,(char *)0x0,status);
  ffgkyjj(infptr,"NAXIS2",&local_38,(char *)0x0,status);
  ffgkyjj(outfptr,"NAXIS1",(LONGLONG *)&local_40,(char *)0x0,status);
  ffgkyjj(outfptr,"NAXIS2",&local_60,(char *)0x0,status);
  if (0 < *status) {
    return *status;
  }
  if (local_40 != local_b8) {
    ffpmsg("Input and output tables do not have same width (ffcprw)");
    *status = 0xf1;
    return 0xf1;
  }
  if (local_38 < nrows + firstrow + -1) {
    ffpmsg("Not enough rows in input table to copy (ffcprw)");
    *status = 0x133;
    return 0x133;
  }
  iVar5 = infptr->Fptr->tfield;
  iVar2 = outfptr->Fptr->tfield;
  local_98 = (long *)(long)iVar2;
  if (iVar5 != iVar2) {
    ffpmsg("Input and output tables do not have same number of columns (ffcprw)");
    *status = 0x12e;
    return 0x12e;
  }
  values = (uchar *)malloc(local_b8);
  if (values == (uchar *)0x0) {
    ffpmsg("Unable to allocate memory (ffcprw)");
    *status = 0x71;
    return 0x71;
  }
  piVar6 = (int *)malloc((long)iVar5 << 2);
  local_a8 = piVar6;
  local_80 = (int *)malloc((long)local_98 << 2);
  fffvcl(infptr,&local_bc,piVar6,status);
  piVar6 = local_80;
  fffvcl(outfptr,&local_ac,local_80,status);
  if (local_bc != local_ac) {
LAB_0011e645:
    ffpmsg("Input and output tables have different variable columns (ffcprw)");
    *status = 0x12e;
    local_c8 = (void *)0x0;
    goto LAB_0011e727;
  }
  if (0 < local_bc) {
    lVar8 = 0;
    do {
      if (local_a8[lVar8] != piVar6[lVar8]) goto LAB_0011e645;
      lVar8 = lVar8 + 1;
    } while (local_bc != lVar8);
  }
  local_a0 = nrows + firstrow;
  lVar8 = local_60 + 1;
  if (local_bc == 0) {
    if (0 < nrows) {
      do {
        ffgtbb(infptr,firstrow,1,local_b8,values,status);
        ffptbb(outfptr,lVar8,1,local_b8,values,status);
        lVar8 = lVar8 + 1;
        firstrow = firstrow + 1;
      } while (firstrow < local_a0);
    }
LAB_0011e6db:
    local_c8 = (void *)0x0;
  }
  else {
    ffirow(outfptr,local_60,nrows,status);
    if (nrows < 1) goto LAB_0011e6db;
    local_c8 = (void *)0x0;
    local_78 = 0;
    do {
      ffgtbb(infptr,firstrow,1,local_b8,values,status);
      local_90 = lVar8;
      ffptbb(outfptr,lVar8,1,local_b8,values,status);
      lVar9 = local_a0;
      if (0 < infptr->Fptr->tfield) {
        plVar10 = &infptr->Fptr->tableptr->twidth;
        lVar11 = 0;
        piVar6 = local_a8;
        lVar8 = 1;
        do {
          if ((lVar11 < local_bc) && (lVar8 == piVar6[lVar11])) {
            local_98 = plVar10;
            local_50 = lVar8;
            local_48 = lVar11;
            ffgdesll(infptr,(int)lVar8,firstrow,(LONGLONG *)&local_88,&local_68,status);
            __size = local_88;
            if (*(int *)(local_98 + -9) != -0x10) {
              if (*(int *)(local_98 + -9) == -1) {
                lVar8 = local_88 + 0xe;
                if (-1 < (long)(local_88 + 7)) {
                  lVar8 = local_88 + 7;
                }
                __size = lVar8 >> 3;
              }
              else {
                __size = local_88 * *local_98;
              }
            }
            pFVar3 = outfptr->Fptr;
            local_70 = pFVar3->heapstart + pFVar3->datastart + pFVar3->heapsize;
            ffmbyt(infptr,infptr->Fptr->heapstart + infptr->Fptr->datastart + local_68,0,status);
            pFVar3 = outfptr->Fptr;
            if (pFVar3->lasthdu == 0) {
              if ((pFVar3->headstart[(long)pFVar3->curhdu + 1] < (long)(local_70 + __size)) &&
                 (iVar5 = ffiblk(outfptr,(long)(local_70 + __size +
                                               ~pFVar3->headstart[(long)pFVar3->curhdu + 1]) / 0xb40
                                         + 1,1,status), 0 < iVar5)) {
                ffpmsg("Failed to extend the size of the variable length heap (ffcprw)");
                goto LAB_0011e727;
              }
            }
            local_58 = __size;
            if (__size != 0) {
              if ((long)local_78 < (long)__size) {
                pvVar7 = realloc(local_c8,__size);
                if (pvVar7 == (void *)0x0) {
                  *status = 0x71;
                  ffpmsg("failed to allocate memory for variable column copy (ffcprw)");
                  iVar5 = 5;
                  pvVar7 = extraout_RAX;
                }
                else {
                  iVar5 = 0;
                  local_c8 = pvVar7;
                  local_78 = __size;
                }
                if (iVar5 != 0) {
                  if (iVar5 != 5) {
                    return (int)pvVar7;
                  }
                  goto LAB_0011e727;
                }
              }
              ffgbyt(infptr,__size,local_c8,status);
              ffmbyt(outfptr,local_70,1,status);
              ffpbyt(outfptr,__size,local_c8,status);
            }
            lVar8 = local_50;
            ffpdes(outfptr,(int)local_50,local_90,local_88,outfptr->Fptr->heapsize,status);
            pLVar1 = &outfptr->Fptr->heapsize;
            *pLVar1 = *pLVar1 + local_58;
            lVar11 = local_48 + 1;
            piVar6 = local_a8;
            lVar9 = local_a0;
            plVar10 = local_98;
          }
          plVar10 = plVar10 + 0x14;
          bVar4 = lVar8 < infptr->Fptr->tfield;
          lVar8 = lVar8 + 1;
        } while (bVar4);
      }
      lVar8 = local_90 + 1;
      firstrow = firstrow + 1;
    } while (firstrow < lVar9);
  }
  local_60 = local_60 + nrows;
  ffuky(outfptr,0x51,"NAXIS2",&local_60,(char *)0x0,status);
LAB_0011e727:
  free(values);
  free(local_a8);
  free(local_80);
  if (local_c8 != (void *)0x0) {
    free(local_c8);
  }
  return *status;
}

Assistant:

int ffcprw(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           LONGLONG firstrow,   /* I - number of first row to copy (1 based)  */
           LONGLONG nrows,      /* I - number of rows to copy  */
           int *status)         /* IO - error status     */
/*
  copy consecutive set of rows from infptr and append it in the outfptr table.
*/
{
    LONGLONG innaxis1, innaxis2, outnaxis1, outnaxis2, ii, jj, icol;
    LONGLONG iVarCol, inPos, outPos, nVarBytes, nVarAllocBytes = 0;
    unsigned char *buffer, *varColBuff=0;
    int nInVarCols=0, nOutVarCols=0, varColDiff=0;
    int *inVarCols=0, *outVarCols=0;
    long nNewBlocks;
    LONGLONG hrepeat=0, hoffset=0;
    tcolumn *colptr=0;
    
    if (*status > 0)
        return(*status);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */

    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */

    if (*status > 0)
        return(*status);

    if ((infptr->Fptr)->hdutype == IMAGE_HDU || (outfptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy rows to or from IMAGE HDUs (ffcprw)");
       return(*status = NOT_TABLE);
    }

    if ( ((infptr->Fptr)->hdutype == BINARY_TBL &&  (outfptr->Fptr)->hdutype == ASCII_TBL) ||
         ((infptr->Fptr)->hdutype == ASCII_TBL &&  (outfptr->Fptr)->hdutype == BINARY_TBL) )
    {
       ffpmsg
       ("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
       return(*status = NOT_BTABLE);
    }

    ffgkyjj(infptr,  "NAXIS1", &innaxis1,  0, status);  /* width of input rows */
    ffgkyjj(infptr,  "NAXIS2", &innaxis2,  0, status);  /* no. of input rows */
    ffgkyjj(outfptr, "NAXIS1", &outnaxis1, 0, status);  /* width of output rows */
    ffgkyjj(outfptr, "NAXIS2", &outnaxis2, 0, status);  /* no. of output rows */

    if (*status > 0)
        return(*status);

    if (outnaxis1 != innaxis1) {
       ffpmsg
       ("Input and output tables do not have same width (ffcprw)");
       return(*status = BAD_ROW_WIDTH);
    }    

    if (firstrow + nrows - 1 > innaxis2) {
       ffpmsg
       ("Not enough rows in input table to copy (ffcprw)");
       return(*status = BAD_ROW_NUM);
    }
    
    if ((infptr->Fptr)->tfield != (outfptr->Fptr)->tfield)
    {
       ffpmsg
       ("Input and output tables do not have same number of columns (ffcprw)");
       return(*status = BAD_COL_NUM);
    }
    
    /* allocate buffer to hold 1 row of data */
    buffer = malloc( (size_t) innaxis1);
    if (!buffer) {
       ffpmsg
       ("Unable to allocate memory (ffcprw)");
       return(*status = MEMORY_ALLOCATION);
    }
 
    inVarCols = malloc(infptr->Fptr->tfield*sizeof(int));
    outVarCols = malloc(outfptr->Fptr->tfield*sizeof(int));
    fffvcl(infptr, &nInVarCols, inVarCols, status);
    fffvcl(outfptr, &nOutVarCols, outVarCols, status);
    if (nInVarCols != nOutVarCols)
       varColDiff=1;
    else
    {
       for (ii=0; ii<nInVarCols; ++ii)
       {
          if (inVarCols[ii] != outVarCols[ii])
          {
             varColDiff=1;
             break;
          }
       }
    }
    
    if (varColDiff)
    {
       ffpmsg("Input and output tables have different variable columns (ffcprw)");
       *status = BAD_COL_NUM;
       goto CLEANUP_RETURN;
    }
    
    jj = outnaxis2 + 1;
    if (nInVarCols)
    {
       ffirow(outfptr, outnaxis2, nrows, status);
       for (ii = firstrow; ii < firstrow + nrows; ii++)
       {
          fits_read_tblbytes (infptr, ii, 1, innaxis1, buffer, status);
          fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
          /* Now make corrections for variable length columns */
          iVarCol=0;
          colptr = (infptr->Fptr)->tableptr;
          for (icol=0; icol<(infptr->Fptr)->tfield; ++icol)
          {
             if (iVarCol < nInVarCols && inVarCols[iVarCol] == icol+1)
             {
                /* Copy from a variable length column */
                
                ffgdesll(infptr, icol+1, ii, &hrepeat, &hoffset, status);
                /* If this is a bit column, hrepeat will be number of
                   bits, not bytes. If it is a string column, hrepeat
		   is the number of bytes, twidth is the max col width 
		   and can be ignored.*/
                if (colptr->tdatatype == -TBIT)
		{
		   nVarBytes = (hrepeat+7)/8;
		}
		else if (colptr->tdatatype == -TSTRING)
		{
		   nVarBytes = hrepeat;
		}
		else
		{
		   nVarBytes = hrepeat*colptr->twidth*sizeof(char);
		}
                inPos = (infptr->Fptr)->datastart + (infptr->Fptr)->heapstart
				+ hoffset;
		outPos = (outfptr->Fptr)->datastart + (outfptr->Fptr)->heapstart
				+ (outfptr->Fptr)->heapsize;
                ffmbyt(infptr, inPos, REPORT_EOF, status);
		/* If this is not the last HDU in the file, then check if */
		/* extending the heap would overwrite the following header. */
		/* If so, then have to insert more blocks. */
                if ( !((outfptr->Fptr)->lasthdu) )
                {
		   if (outPos+nVarBytes > 
		      (outfptr->Fptr)->headstart[(outfptr->Fptr)->curhdu+1])
		   {
		      nNewBlocks = (long)(((outPos+nVarBytes - 1 -
                        (outfptr->Fptr)->headstart[(outfptr->Fptr)->
                        curhdu+1]) / 2880) + 1);
                      if (ffiblk(outfptr, nNewBlocks, 1, status) > 0)
                      {
                         ffpmsg("Failed to extend the size of the variable length heap (ffcprw)");
			 goto CLEANUP_RETURN;
                      }

		   }
                }
                if (nVarBytes)
		{
		   if (nVarBytes > nVarAllocBytes)
		   {
		     /* Grow the copy buffer to accomodate the new maximum size. 
			Note it is safe to call realloc() with null input pointer, 
			which is equivalent to malloc(). */
		     unsigned char *varColBuff1 = (unsigned char *) realloc(varColBuff, nVarBytes);
		     if (! varColBuff1)
		     {
		       *status = MEMORY_ALLOCATION;
		       ffpmsg("failed to allocate memory for variable column copy (ffcprw)");
		       goto CLEANUP_RETURN;
		     }
		     /* Record the new state */
		     varColBuff = varColBuff1;
		     nVarAllocBytes = nVarBytes;
		   }
		   /* Copy date from input to output */
                   ffgbyt(infptr, nVarBytes, varColBuff, status);
		   ffmbyt(outfptr, outPos, IGNORE_EOF, status);
                   ffpbyt(outfptr, nVarBytes, varColBuff, status);
		}
		ffpdes(outfptr, icol+1, jj, hrepeat, (outfptr->Fptr)->heapsize, status);
                (outfptr->Fptr)->heapsize += nVarBytes;
                ++iVarCol;
             }
             ++colptr;
          }
          ++jj;
       }
    }
    else
    {    
       /* copy the rows, 1 at a time */
       for (ii = firstrow; ii < firstrow + nrows; ii++) {
           fits_read_tblbytes (infptr,  ii, 1, innaxis1, buffer, status);
           fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
           jj++;
       }
    }
    outnaxis2 += nrows;
    fits_update_key(outfptr, TLONGLONG, "NAXIS2", &outnaxis2, 0, status);

 CLEANUP_RETURN:
    free(buffer);
    free(inVarCols);
    free(outVarCols);
    if (varColBuff) free(varColBuff);
    return(*status);
}